

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  char *pcVar1;
  int iVar2;
  ostream *poVar3;
  Scene *this;
  time_t __seedval;
  Camera *this_00;
  undefined8 *in_RSI;
  int in_EDI;
  float materials_size;
  Object *_objects_list;
  Scene _scene;
  Camera _camera;
  float _shutter_close;
  float _shutter_open;
  float _focus_distance;
  float _aperture;
  float _aspect;
  float _fov;
  Vec3 _up;
  Vec3 _lookat;
  Vec3 _origin;
  Image2D *_image;
  string _name;
  string _type;
  int _samples;
  int _height;
  int _width;
  size_t *in_stack_fffffffffffffbf8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc00;
  int in_stack_fffffffffffffc08;
  undefined4 in_stack_fffffffffffffc0c;
  char *pcVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc30;
  allocator *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  Image2D *this_01;
  Image2D *in_stack_fffffffffffffcf0;
  Object *in_stack_fffffffffffffcf8;
  Camera *in_stack_fffffffffffffd00;
  int in_stack_fffffffffffffd0c;
  int in_stack_fffffffffffffd10;
  int in_stack_fffffffffffffd14;
  float in_stack_fffffffffffffd20;
  float in_stack_fffffffffffffd24;
  float in_stack_fffffffffffffd28;
  float in_stack_fffffffffffffd2c;
  float in_stack_fffffffffffffd30;
  float in_stack_fffffffffffffd34;
  Vec3 *in_stack_fffffffffffffd38;
  Vec3 *in_stack_fffffffffffffd40;
  Camera *in_stack_fffffffffffffd50;
  Vec3 local_294;
  Vec3 local_288;
  Vec3 local_27c;
  Scene *local_270;
  allocator local_261;
  string local_260 [39];
  allocator local_239;
  string local_238 [39];
  undefined1 local_211 [40];
  allocator local_1e9;
  string local_1e8 [32];
  string local_1c8 [32];
  string local_1a8 [32];
  string local_188 [32];
  string local_168 [24];
  Scene *in_stack_fffffffffffffeb0;
  string local_148 [32];
  string local_128 [32];
  string local_108 [32];
  string local_e8 [39];
  allocator local_c1;
  string local_c0 [39];
  allocator local_99;
  string local_98 [32];
  int local_78;
  allocator local_71;
  string local_70 [32];
  int local_50;
  allocator local_39;
  string local_38 [36];
  int local_14;
  undefined8 *local_10;
  int local_4;
  
  local_4 = 0;
  local_10 = in_RSI;
  if (in_EDI < 5) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Usage: ");
    poVar3 = std::operator<<(poVar3,(char *)*local_10);
    std::operator<<(poVar3," width height samples filename\n");
    local_4 = 1;
  }
  else {
    pcVar4 = (char *)in_RSI[1];
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_38,pcVar4,&local_39);
    iVar2 = std::__cxx11::stoi(in_stack_fffffffffffffc00,in_stack_fffffffffffffbf8,0);
    std::__cxx11::string::~string(local_38);
    std::allocator<char>::~allocator((allocator<char> *)&local_39);
    pcVar4 = (char *)local_10[2];
    local_14 = iVar2;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_70,pcVar4,&local_71);
    iVar2 = std::__cxx11::stoi(in_stack_fffffffffffffc00,in_stack_fffffffffffffbf8,0);
    std::__cxx11::string::~string(local_70);
    std::allocator<char>::~allocator((allocator<char> *)&local_71);
    pcVar4 = (char *)local_10[3];
    local_50 = iVar2;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_98,pcVar4,&local_99);
    iVar2 = std::__cxx11::stoi(in_stack_fffffffffffffc00,in_stack_fffffffffffffbf8,0);
    std::__cxx11::string::~string(local_98);
    std::allocator<char>::~allocator((allocator<char> *)&local_99);
    pcVar4 = (char *)local_10[5];
    local_78 = iVar2;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_c0,pcVar4,&local_c1);
    std::allocator<char>::~allocator((allocator<char> *)&local_c1);
    pcVar4 = (char *)local_10[4];
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1e8,pcVar4,&local_1e9);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffffc0c,in_stack_fffffffffffffc08),
                   (char *)in_stack_fffffffffffffc00);
    __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_10[1];
    this_01 = (Image2D *)local_211;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)(local_211 + 1),(char *)__lhs,(allocator *)this_01);
    std::operator+(__lhs,in_stack_fffffffffffffc30);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffffc0c,in_stack_fffffffffffffc08),
                   (char *)in_stack_fffffffffffffc00);
    pcVar4 = (char *)local_10[2];
    __rhs = &local_239;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_238,pcVar4,__rhs);
    std::operator+(__lhs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__rhs)
    ;
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffffc0c,in_stack_fffffffffffffc08),
                   (char *)in_stack_fffffffffffffc00);
    pcVar1 = (char *)local_10[3];
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_260,pcVar1,&local_261);
    std::operator+(__lhs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__rhs)
    ;
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffffc0c,in_stack_fffffffffffffc08),
                   (char *)in_stack_fffffffffffffc00);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffffc0c,in_stack_fffffffffffffc08),
                   in_stack_fffffffffffffc00);
    std::__cxx11::string::~string(local_108);
    std::__cxx11::string::~string(local_128);
    std::__cxx11::string::~string(local_260);
    std::allocator<char>::~allocator((allocator<char> *)&local_261);
    std::__cxx11::string::~string(local_148);
    std::__cxx11::string::~string(local_168);
    std::__cxx11::string::~string(local_238);
    std::allocator<char>::~allocator((allocator<char> *)&local_239);
    std::__cxx11::string::~string(local_188);
    std::__cxx11::string::~string(local_1a8);
    std::__cxx11::string::~string((string *)(local_211 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_211);
    std::__cxx11::string::~string(local_1c8);
    std::__cxx11::string::~string(local_1e8);
    std::allocator<char>::~allocator((allocator<char> *)&local_1e9);
    this = (Scene *)operator_new(0x238);
    Image2D::Image2D(this_01,__lhs,(string *)__rhs,(int)((ulong)pcVar4 >> 0x20),(int)pcVar4);
    local_270 = this;
    __seedval = time((time_t *)0x0);
    srand48(__seedval);
    Vec3::Vec3(&local_27c,13.0,4.0,4.0);
    Vec3::Vec3(&local_288,0.0,0.0,0.0);
    Vec3::Vec3(&local_294,0.0,1.0,0.0);
    operator-((Vec3 *)CONCAT44(in_stack_fffffffffffffc0c,in_stack_fffffffffffffc08),
              (Vec3 *)in_stack_fffffffffffffc00);
    iVar2 = (int)((ulong)in_stack_fffffffffffffc00 >> 0x20);
    materials_size = Vec3::length((Vec3 *)0x127403);
    Vec3::~Vec3((Vec3 *)&stack0xfffffffffffffd50);
    Camera::Camera(in_stack_fffffffffffffd50,(Vec3 *)0x3f800000,in_stack_fffffffffffffd40,
                   in_stack_fffffffffffffd38,in_stack_fffffffffffffd34,in_stack_fffffffffffffd30,
                   in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28,in_stack_fffffffffffffd24,
                   in_stack_fffffffffffffd20);
    Scene::Scene(this,(int)materials_size,in_stack_fffffffffffffc08,iVar2);
    this_00 = (Camera *)Scene::Create(in_stack_fffffffffffffeb0);
    compute_ray_tracing(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10,
                        in_stack_fffffffffffffd0c,in_stack_fffffffffffffd00,
                        in_stack_fffffffffffffcf8,in_stack_fffffffffffffcf0);
    safe_delete<Image2D>((Image2D **)this_00);
    safe_delete<Object>((Object **)this_00);
    local_4 = 0;
    Scene::~Scene(this);
    Camera::~Camera(this_00);
    Vec3::~Vec3(&local_294);
    Vec3::~Vec3(&local_288);
    Vec3::~Vec3(&local_27c);
    std::__cxx11::string::~string(local_e8);
    std::__cxx11::string::~string(local_c0);
  }
  return local_4;
}

Assistant:

int main (int argc, char *argv[])
{
    if (argc < 5) {
        std::cerr << "Usage: " << argv[0] << " width height samples filename\n";
        return 1;
    }

// Image
    const int         _width   = std::stoi(argv[1]);
    const int         _height  = std::stoi(argv[2]);
    const int         _samples = std::stoi(argv[3]);
	const std::string _type    = std::string(argv[5]);
    const std::string _name    = std::string(argv[4]) + "_" + std::string(argv[1]) + "_" + std::string(argv[2]) + "_" + std::string(argv[3]) + "." + _type;
	Image2D		     *_image   = new Image2D(_name, _type, _width, _height);

#ifdef RANDOM_SCENE
	INIT_RANDOM_GEN();
#endif

// Camera
    const Vec3  _origin         = Vec3(13.0f,  4.0f,  4.0f);
    const Vec3  _lookat         = Vec3( 0.0f,  0.0f,  0.0f);
    const Vec3  _up             = Vec3( 0.0f,  1.0f,  0.0f);
    const float _fov            = 20.0f;
    const float _aspect         = static_cast<float>(_width) / static_cast<float>(_height);
    const float _aperture       = 0.0f;
    const float _focus_distance = (_origin - _lookat).length();
    const float _shutter_open   = 0.0f;;
    const float _shutter_close  = 1.0f;;

    Camera _camera(_origin, _lookat, _up, _fov, _aspect, _aperture, _focus_distance, _shutter_open, _shutter_close);

// Scene
    Scene   _scene(500,500,500);
    Object *_objects_list = _scene.Create();

// Ray Tracing
	compute_ray_tracing(_width, _height, _samples, &_camera, _objects_list, _image);

// Clean
    safe_delete(_image);
    safe_delete(_objects_list);

    return 0;
}